

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolutil.cpp
# Opt level: O3

UBool utm_hasCapacity(UToolMemory *mem,int32_t capacity)

{
  int iVar1;
  UBool UVar2;
  void *pvVar3;
  int capacity_00;
  int iVar4;
  size_t s;
  UToolMemory *pUVar5;
  
  iVar4 = mem->capacity;
  UVar2 = (UBool)iVar4;
  if (iVar4 < capacity) {
    iVar1 = mem->maxCapacity;
    if (iVar1 < capacity) {
      pUVar5 = mem;
      utm_hasCapacity();
      iVar4 = (int)pUVar5;
LAB_0021bfc0:
      utm_hasCapacity();
      iVar1 = mem->idx;
      capacity_00 = iVar1 + iVar4;
      utm_hasCapacity(mem,capacity_00);
      mem->idx = capacity_00;
      pvVar3 = memset((void *)((long)(iVar1 * mem->size) + (long)mem->array),0,
                      (long)(mem->size * iVar4));
      return (UBool)pvVar3;
    }
    if ((capacity < iVar4 * 2) && (capacity = iVar4 * 2, iVar1 / 3 < iVar4)) {
      capacity = iVar1;
    }
    s = (long)capacity * (long)mem->size;
    if ((UAlignedMemory *)mem->array == mem->staticArray) {
      pvVar3 = uprv_malloc_63(s);
      iVar4 = (int)s;
      mem->array = pvVar3;
      if (pvVar3 == (void *)0x0) goto LAB_0021bfc0;
      pvVar3 = memcpy(pvVar3,mem->staticArray,(long)mem->size * (long)mem->idx);
    }
    else {
      pvVar3 = uprv_realloc_63(mem->array,s);
      iVar4 = (int)s;
      mem->array = pvVar3;
      if (pvVar3 == (void *)0x0) goto LAB_0021bfc0;
    }
    UVar2 = (UBool)pvVar3;
    mem->capacity = capacity;
  }
  return UVar2;
}

Assistant:

static UBool
utm_hasCapacity(UToolMemory *mem, int32_t capacity) {
    if(mem->capacity<capacity) {
        int32_t newCapacity;

        if(mem->maxCapacity<capacity) {
            fprintf(stderr, "error: %s - trying to use more than maxCapacity=%ld units\n",
                    mem->name, (long)mem->maxCapacity);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }

        /* try to allocate a larger array */
        if(capacity>=2*mem->capacity) {
            newCapacity=capacity;
        } else if(mem->capacity<=mem->maxCapacity/3) {
            newCapacity=2*mem->capacity;
        } else {
            newCapacity=mem->maxCapacity;
        }

        if(mem->array==mem->staticArray) {
            mem->array=uprv_malloc(newCapacity*mem->size);
            if(mem->array!=NULL) {
                uprv_memcpy(mem->array, mem->staticArray, (size_t)mem->idx*mem->size);
            }
        } else {
            mem->array=uprv_realloc(mem->array, newCapacity*mem->size);
        }

        if(mem->array==NULL) {
            fprintf(stderr, "error: %s - out of memory\n", mem->name);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        mem->capacity=newCapacity;
    }

    return TRUE;
}